

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reparser.cpp
# Opt level: O3

bool __thiscall psy::C::Reparser::ambiguityPersists(Reparser *this,SyntaxNode *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ostream *poVar3;
  __node_base *p_Var4;
  
  iVar2 = (*(node->super_Managed)._vptr_Managed[0xd3])(node);
  if (((CONCAT44(extraout_var,iVar2) == 0) &&
      (iVar2 = (*(node->super_Managed)._vptr_Managed[0xd5])(node),
      CONCAT44(extraout_var_00,iVar2) == 0)) &&
     (iVar2 = (*(node->super_Managed)._vptr_Managed[0xd1])(node),
     CONCAT44(extraout_var_01,iVar2) == 0)) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/reparser/Reparser.cpp"
               ,0x5b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"node isn\'t ambiguous node",0x19);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    bVar1 = false;
  }
  else if ((this->strategies_).
           super__Vector_base<psy::C::Reparser::DisambiguationStrategy,_std::allocator<psy::C::Reparser::DisambiguationStrategy>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           (this->strategies_).
           super__Vector_base<psy::C::Reparser::DisambiguationStrategy,_std::allocator<psy::C::Reparser::DisambiguationStrategy>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = true;
  }
  else {
    p_Var4 = &(this->persistentAmbigs_)._M_h._M_before_begin;
    do {
      p_Var4 = p_Var4->_M_nxt;
      bVar1 = p_Var4 != (__node_base *)0x0;
      if (p_Var4 == (__node_base *)0x0) {
        return bVar1;
      }
    } while ((SyntaxNode *)p_Var4[1]._M_nxt != node);
  }
  return bVar1;
}

Assistant:

bool Reparser::ambiguityPersists(const SyntaxNode* node) const
{
    PSY_ASSERT_3(node->asAmbiguousCastOrBinaryExpression()
                        || node->asAmbiguousExpressionOrDeclarationStatement()
                        || node->asAmbiguousTypeNameOrExpressionAsTypeReference(),
                     return false,
                     "node isn't ambiguous node");

    if (strategies_.empty())
        return true;

    for (auto ambig : persistentAmbigs_) {
        if (node == ambig)
            return true;
    }
    return false;
}